

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

unsigned_short
GeneratedSaxParser::Utils::toInteger<unsigned_short,false>(ParserChar *buffer,bool *failed)

{
  bool bVar1;
  uint uVar2;
  undefined1 *in_RSI;
  char *in_RDI;
  bool digitFound;
  unsigned_short sign;
  unsigned_short value;
  ParserChar *s;
  unsigned_short local_22;
  char *local_20;
  
  if (in_RDI == (char *)0x0) {
    *in_RSI = 1;
  }
  else {
    local_20 = in_RDI;
    if (*in_RDI == '\0') {
      *in_RSI = 1;
    }
    else {
      do {
        bVar1 = isWhiteSpace(*local_20);
        if (!bVar1) {
          local_22 = 0;
          bVar1 = false;
          while( true ) {
            if (*local_20 == '\0') {
              *in_RSI = 0;
              return local_22;
            }
            uVar2 = isdigit((int)*local_20);
            if ((uVar2 & 1) == 0) break;
            local_22 = local_22 * 10 + *local_20 + -0x30;
            bVar1 = true;
            local_20 = local_20 + 1;
          }
          if (bVar1) {
            *in_RSI = 0;
            return local_22;
          }
          *in_RSI = 1;
          return 0;
        }
        local_20 = local_20 + 1;
      } while (*local_20 != '\0');
      *in_RSI = 1;
    }
  }
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}